

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::processElementDeclaration
          (PSVIWriterHandlers *this,XSElementDeclaration *element)

{
  byte bVar1;
  short sVar2;
  SCOPE SVar3;
  VALUE_CONSTRAINT valueConstraintType;
  XMLCh *pXVar4;
  XSTypeDefinition *type;
  XSComplexTypeDefinition *enclosingCTD;
  XSNamedMap<xercesc_4_0::XSIDCDefinition> *idConstraint;
  XSElementDeclaration *elemDecl;
  XSAnnotation *annotation;
  XSElementDeclaration *element_local;
  PSVIWriterHandlers *this_local;
  
  if (element == (XSElementDeclaration *)0x0) {
    sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElementDeclaration);
  }
  else {
    sendIndentedElementWithID
              (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElementDeclaration,(XSObject *)element);
    pXVar4 = (XMLCh *)(**(code **)(*(long *)element + 0x10))();
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgName,pXVar4);
    pXVar4 = (XMLCh *)(**(code **)(*(long *)element + 0x18))();
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgTargetNamespace,pXVar4);
    type = xercesc_4_0::XSElementDeclaration::getTypeDefinition(element);
    processTypeDefinitionOrRef(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgTypeDefinition,type);
    enclosingCTD = xercesc_4_0::XSElementDeclaration::getEnclosingCTDefinition(element);
    SVar3 = xercesc_4_0::XSElementDeclaration::getScope(element);
    processScope(this,enclosingCTD,(short)SVar3);
    valueConstraintType = xercesc_4_0::XSElementDeclaration::getConstraintType();
    pXVar4 = (XMLCh *)xercesc_4_0::XSElementDeclaration::getConstraintValue();
    processValueConstraint(this,valueConstraintType,pXVar4);
    bVar1 = xercesc_4_0::XSElementDeclaration::getNillable();
    pXVar4 = translateBool(this,(bool)(bVar1 & 1));
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNillable,pXVar4);
    idConstraint = xercesc_4_0::XSElementDeclaration::getIdentityConstraints(element);
    processIdentityConstraintDefinition(this,idConstraint);
    elemDecl = xercesc_4_0::XSElementDeclaration::getSubstitutionGroupAffiliation(element);
    processElementDeclarationRef
              (this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSubstitutionGroupAffiliation,elemDecl);
    sVar2 = xercesc_4_0::XSElementDeclaration::getSubstitutionGroupExclusions(element);
    pXVar4 = translateBlockOrFinal(this,sVar2);
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSubstitutionGroupExclusions,pXVar4);
    sVar2 = xercesc_4_0::XSElementDeclaration::getDisallowedSubstitutions(element);
    pXVar4 = translateBlockOrFinal(this,sVar2);
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgDisallowedSubstitutions,pXVar4);
    bVar1 = xercesc_4_0::XSElementDeclaration::getAbstract();
    pXVar4 = translateBool(this,(bool)(bVar1 & 1));
    sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAbstract,pXVar4);
    annotation = xercesc_4_0::XSElementDeclaration::getAnnotation(element);
    processAnnotation(this,annotation);
    sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElementDeclaration);
  }
  return;
}

Assistant:

void PSVIWriterHandlers::processElementDeclaration(XSElementDeclaration* element) {
	if (element == NULL) {
		sendElementEmpty(PSVIUni::fgElementDeclaration);
	} else {
		sendIndentedElementWithID(PSVIUni::fgElementDeclaration, (XSObject*) element);
		sendElementValue(PSVIUni::fgName, element->getName());
		sendElementValue(PSVIUni::fgTargetNamespace, element->getNamespace());
		processTypeDefinitionOrRef(PSVIUni::fgTypeDefinition, element->getTypeDefinition());
		processScope(element->getEnclosingCTDefinition(), element->getScope());
		processValueConstraint(element->getConstraintType(), element->getConstraintValue());
		sendElementValue(PSVIUni::fgNillable, translateBool(element->getNillable()));
		processIdentityConstraintDefinition(element->getIdentityConstraints());
		processElementDeclarationRef(PSVIUni::fgSubstitutionGroupAffiliation,
			element->getSubstitutionGroupAffiliation());
		sendElementValue(PSVIUni::fgSubstitutionGroupExclusions,
			translateBlockOrFinal(element->getSubstitutionGroupExclusions()));
		sendElementValue(PSVIUni::fgDisallowedSubstitutions,
			translateBlockOrFinal(element->getDisallowedSubstitutions()));
		sendElementValue(PSVIUni::fgAbstract, translateBool(element->getAbstract()));
		processAnnotation(element->getAnnotation());
		sendUnindentedElement(PSVIUni::fgElementDeclaration);
	}
}